

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O0

int __thiscall
ICM::DefFunc::Comp::NumComp::sign
          (NumComp *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  DefaultType local_7c;
  TypeObject local_78;
  DefaultType local_60 [2];
  TypeObject local_58;
  TypeObject TStack_40;
  InitList local_28;
  EVP_PKEY_CTX *local_18;
  NumComp *this_local;
  
  local_60[1] = 8;
  local_18 = ctx;
  this_local = this;
  TypeObject::TypeObject(&local_58,local_60 + 1);
  local_60[0] = T_Number;
  TypeObject::TypeObject(&TStack_40,local_60);
  local_28._M_array = &local_58;
  local_28._M_len = 2;
  local_7c = T_Boolean;
  TypeObject::TypeObject(&local_78,&local_7c);
  Function::Signature::Signature((Signature *)this,&local_28,&local_78,false);
  return (int)this;
}

Assistant:

S sign() const {
					return S({ T_Number, T_Number }, T_Boolean); // (N N) -> Bool
				}